

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrusive-list.h
# Opt level: O2

unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> __thiscall
wabt::intrusive_list<wabt::Expr>::extract(intrusive_list<wabt::Expr> *this,iterator pos)

{
  Expr *pEVar1;
  Expr *pEVar2;
  bool bVar3;
  reference pEVar4;
  intrusive_list<wabt::Expr> *piVar5;
  iterator rhs;
  iterator local_20;
  
  local_20.list_ = (intrusive_list<wabt::Expr> *)pos.node_;
  rhs.list_ = pos.list_;
  if ((((Location *)&(rhs.list_)->size_)->filename)._M_len == 0) {
    __assert_fail("!empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/include/wabt/intrusive-list.h"
                  ,0x221,
                  "std::unique_ptr<T> wabt::intrusive_list<wabt::Expr>::extract(iterator) [T = wabt::Expr]"
                 );
  }
  rhs.node_ = (Expr *)0x0;
  bVar3 = iterator::operator!=(&local_20,rhs);
  if (bVar3) {
    pEVar4 = iterator::operator*(&local_20);
    if ((rhs.list_)->first_ == (rhs.list_)->last_) {
      (rhs.list_)->first_ = (Expr *)0x0;
      (rhs.list_)->last_ = (Expr *)0x0;
    }
    else {
      pEVar1 = (pEVar4->super_intrusive_list_base<wabt::Expr>).next_;
      pEVar2 = (pEVar4->super_intrusive_list_base<wabt::Expr>).prev_;
      piVar5 = (intrusive_list<wabt::Expr> *)&pEVar2->super_intrusive_list_base<wabt::Expr>;
      if (pEVar2 == (Expr *)0x0) {
        piVar5 = rhs.list_;
      }
      piVar5->first_ = pEVar1;
      if (pEVar1 == (Expr *)0x0) {
        (rhs.list_)->last_ = pEVar2;
      }
      else {
        (pEVar1->super_intrusive_list_base<wabt::Expr>).prev_ = pEVar2;
      }
    }
    (pEVar4->super_intrusive_list_base<wabt::Expr>).next_ = (Expr *)0x0;
    (pEVar4->super_intrusive_list_base<wabt::Expr>).prev_ = (Expr *)0x0;
    (((Location *)&(rhs.list_)->size_)->filename)._M_len =
         (((Location *)&(rhs.list_)->size_)->filename)._M_len - 1;
    this->first_ = pEVar4;
    return (__uniq_ptr_data<wabt::Expr,_std::default_delete<wabt::Expr>,_true,_true>)
           (__uniq_ptr_data<wabt::Expr,_std::default_delete<wabt::Expr>,_true,_true>)this;
  }
  __assert_fail("pos != end()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/include/wabt/intrusive-list.h"
                ,0x222,
                "std::unique_ptr<T> wabt::intrusive_list<wabt::Expr>::extract(iterator) [T = wabt::Expr]"
               );
}

Assistant:

inline std::unique_ptr<T> intrusive_list<T>::extract(iterator pos) {
  assert(!empty());
  assert(pos != end());
  T* node = &*pos;
  if (first_ == last_) {
    first_ = last_ = nullptr;
  } else {
    if (node->prev_) {
      node->prev_->next_ = node->next_;
    } else {
      first_ = node->next_;
    }

    if (node->next_) {
      node->next_->prev_ = node->prev_;
    } else {
      last_ = node->prev_;
    }
  }
  node->next_ = node->prev_ = nullptr;
  size_--;
  return std::unique_ptr<T>(node);
}